

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zero_copy_stream_impl.cc
# Opt level: O1

bool __thiscall
google::protobuf::io::FileOutputStream::CopyingFileOutputStream::Write
          (CopyingFileOutputStream *this,void *buffer,int size)

{
  uint uVar1;
  uint uVar2;
  LogMessage *other;
  ssize_t sVar3;
  int *piVar4;
  int iVar5;
  void *__buf;
  LogFinisher local_71;
  void *local_70;
  LogMessage local_68;
  
  local_70 = buffer;
  if (this->is_closed_ == true) {
    internal::LogMessage::LogMessage
              (&local_68,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/io/zero_copy_stream_impl.cc"
               ,0xed);
    other = internal::LogMessage::operator<<(&local_68,"CHECK failed: !is_closed_: ");
    internal::LogFinisher::operator=(&local_71,other);
    internal::LogMessage::~LogMessage(&local_68);
  }
  uVar2 = 0;
  do {
    uVar1 = uVar2;
    if (size - uVar1 == 0 || size < (int)uVar1) break;
    __buf = (void *)((ulong)uVar1 + (long)local_70);
    do {
      sVar3 = write(this->file_,__buf,(long)(int)(size - uVar1));
      iVar5 = (int)sVar3;
      if (-1 < iVar5) break;
      piVar4 = __errno_location();
    } while (*piVar4 == 4);
    if (iVar5 < 1) {
      uVar2 = uVar1;
      if (iVar5 < 0) {
        piVar4 = __errno_location();
        this->errno_ = *piVar4;
      }
    }
    else {
      uVar2 = uVar1 + iVar5;
    }
  } while (0 < iVar5);
  return size <= (int)uVar1;
}

Assistant:

bool FileOutputStream::CopyingFileOutputStream::Write(
    const void* buffer, int size) {
  GOOGLE_CHECK(!is_closed_);
  int total_written = 0;

  const uint8* buffer_base = reinterpret_cast<const uint8*>(buffer);

  while (total_written < size) {
    int bytes;
    do {
      bytes = write(file_, buffer_base + total_written, size - total_written);
    } while (bytes < 0 && errno == EINTR);

    if (bytes <= 0) {
      // Write error.

      // FIXME(kenton):  According to the man page, if write() returns zero,
      //   there was no error; write() simply did not write anything.  It's
      //   unclear under what circumstances this might happen, but presumably
      //   errno won't be set in this case.  I am confused as to how such an
      //   event should be handled.  For now I'm treating it as an error, since
      //   retrying seems like it could lead to an infinite loop.  I suspect
      //   this never actually happens anyway.

      if (bytes < 0) {
        errno_ = errno;
      }
      return false;
    }
    total_written += bytes;
  }

  return true;
}